

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::Own<kj::(anonymous_namespace)::AsyncPipe::AbortedRead>::~Own
          (Own<kj::(anonymous_namespace)::AsyncPipe::AbortedRead> *this)

{
  AbortedRead *pAVar1;
  
  pAVar1 = this->ptr;
  if (pAVar1 != (AbortedRead *)0x0) {
    this->ptr = (AbortedRead *)0x0;
    (**this->disposer->_vptr_Disposer)
              (this->disposer,
               (pAVar1->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream[-2] +
               (long)&(pAVar1->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }